

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O3

void buf_logs_write(MppBufLogs *logs,RK_U32 group_id,RK_S32 buffer_id,MppBufOps ops,RK_S32 ref_count
                   ,char *caller)

{
  ushort uVar1;
  MppBufLog *pMVar2;
  ushort uVar3;
  ushort uVar4;
  
  pthread_mutex_lock((pthread_mutex_t *)logs);
  pMVar2 = logs->logs;
  uVar4 = logs->log_write;
  pMVar2[uVar4].group_id = group_id;
  pMVar2[uVar4].buffer_id = buffer_id;
  pMVar2[uVar4].ops = ops;
  pMVar2[uVar4].ref_count = ref_count;
  pMVar2[uVar4].caller = caller;
  uVar4 = uVar4 + 1;
  uVar1 = logs->max_count;
  if (uVar1 <= uVar4) {
    uVar4 = 0;
  }
  logs->log_write = uVar4;
  if (logs->log_count < uVar1) {
    logs->log_count = logs->log_count + 1;
  }
  else {
    uVar3 = logs->log_read + 1;
    uVar4 = 0;
    if (uVar3 < uVar1) {
      uVar4 = uVar3;
    }
    logs->log_read = uVar4;
  }
  pthread_mutex_unlock((pthread_mutex_t *)logs);
  return;
}

Assistant:

static void buf_logs_write(MppBufLogs *logs, RK_U32 group_id, RK_S32 buffer_id,
                           MppBufOps ops, RK_S32 ref_count, const char *caller)
{
    MppBufLog *log = NULL;

    pthread_mutex_lock(&logs->lock);

    log = &logs->logs[logs->log_write];
    log->group_id   = group_id;
    log->buffer_id  = buffer_id;
    log->ops        = ops;
    log->ref_count  = ref_count;
    log->caller     = caller;

    logs->log_write++;
    if (logs->log_write >= logs->max_count)
        logs->log_write = 0;

    if (logs->log_count < logs->max_count)
        logs->log_count++;
    else {
        logs->log_read++;
        if (logs->log_read >= logs->max_count)
            logs->log_read = 0;
    }

    pthread_mutex_unlock(&logs->lock);
}